

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

int OSSL_PARAM_set_BN(OSSL_PARAM *p,BIGNUM *val)

{
  int iVar1;
  BIGNUM *a;
  BIGNUM *in_RSI;
  long in_RDI;
  size_t bytes;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x20) = 0;
    if ((in_RSI == (BIGNUM *)0x0) || (*(int *)(in_RDI + 8) != 2)) {
      local_4 = 0;
    }
    else {
      iVar1 = BN_is_negative(in_RSI);
      if (iVar1 == 0) {
        iVar1 = BN_num_bits((BIGNUM *)in_RSI);
        a = (BIGNUM *)(long)((iVar1 + 7) / 8);
        *(BIGNUM **)(in_RDI + 0x20) = a;
        if (*(long *)(in_RDI + 0x10) == 0) {
          local_4 = 1;
        }
        else if (*(BIGNUM **)(in_RDI + 0x18) < a) {
          local_4 = 0;
        }
        else {
          *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x18);
          iVar1 = BN_bn2nativepad(a,in_stack_ffffffffffffffd8,0);
          local_4 = (uint)(-1 < iVar1);
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int OSSL_PARAM_set_BN(OSSL_PARAM *p, const BIGNUM *val)
{
    size_t bytes;

    if (p == NULL)
        return 0;
    p->return_size = 0;
    if (val == NULL || p->data_type != OSSL_PARAM_UNSIGNED_INTEGER)
        return 0;

    /* For the moment, only positive values are permitted */
    if (BN_is_negative(val))
        return 0;

    bytes = (size_t)BN_num_bytes(val);
    p->return_size = bytes;
    if (p->data == NULL)
        return 1;
    if (p->data_size >= bytes) {
        p->return_size = p->data_size;
        return BN_bn2nativepad(val, p->data, p->data_size) >= 0;
    }
    return 0;
}